

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O0

void __thiscall httplib::ThreadPool::worker::operator()(worker *this)

{
  bool bVar1;
  reference __x;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  function<void_()> fn;
  worker *this_local;
  
  do {
    std::function<void_()>::function((function<void_()> *)&lock._M_owns);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_40,&this->pool_->mutex_);
    std::condition_variable::operator()
              (&this->pool_->cond_,(unique_lock<std::mutex> *)local_40,(anon_class_8_1_8991fb9c)this
              );
    if (((this->pool_->shutdown_ & 1U) == 0) ||
       (bVar1 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                ::empty(&this->pool_->jobs_), !bVar1)) {
      __x = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
            front(&this->pool_->jobs_);
      std::function<void_()>::operator=((function<void_()> *)&lock._M_owns,__x);
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
      pop_front(&this->pool_->jobs_);
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    if (!bVar1) {
      bVar1 = std::function::operator_cast_to_bool((function *)&lock._M_owns);
      if (!bVar1) {
        __assert_fail("true == static_cast<bool>(fn)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp"
                      ,0x22d,"void httplib::ThreadPool::worker::operator()()");
      }
      std::function<void_()>::operator()((function<void_()> *)&lock._M_owns);
      bVar1 = false;
    }
    std::function<void_()>::~function((function<void_()> *)&lock._M_owns);
  } while (!bVar1);
  return;
}

Assistant:

void operator()() {
                for (;;) {
                    std::function<void()> fn;
                    {
                        std::unique_lock<std::mutex> lock(pool_.mutex_);

                        pool_.cond_.wait(
                            lock, [&] { return !pool_.jobs_.empty() || pool_.shutdown_; });

                        if (pool_.shutdown_ && pool_.jobs_.empty()) { break; }

                        fn = pool_.jobs_.front();
                        pool_.jobs_.pop_front();
                    }

                    assert(true == static_cast<bool>(fn));
                    fn();
                }
            }